

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O3

void sysbvm_stackFrame_returnValueInto(sysbvm_tuple_t value,sysbvm_stackFrameRecord_t *targetRecord)

{
  sysbvm_stackFrameRecord_t *psVar1;
  long *in_FS_OFFSET;
  
  psVar1 = (sysbvm_stackFrameRecord_t *)(*in_FS_OFFSET + -0x10);
  do {
    psVar1 = psVar1->previous;
    if (psVar1 == targetRecord) break;
  } while (psVar1 != (sysbvm_stackFrameRecord_t *)0x0);
  if ((psVar1 != (sysbvm_stackFrameRecord_t *)0x0) &&
     (targetRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION)) {
    sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
    *(sysbvm_tuple_t *)&targetRecord[2].type = value;
    in_FS_OFFSET[-2] = (long)targetRecord;
    longjmp((__jmp_buf_tag *)(targetRecord + 3),1);
  }
  sysbvm_error("Cannot unwind for return into invalid target.");
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_returnValueInto(sysbvm_tuple_t value, sysbvm_stackFrameRecord_t *targetRecord)
{
    if(!sysbvm_stackFrame_isValidRecordInThisContext(targetRecord)
        || targetRecord->type != SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION)
        sysbvm_error("Cannot unwind for return into invalid target.");

    sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
    sysbvm_stackFrameFunctionActivationRecord_t *activationRecord = (sysbvm_stackFrameFunctionActivationRecord_t*)targetRecord;
    activationRecord->result = value;
    sysbvm_stackFrame_activeRecord = targetRecord;
    longjmp(activationRecord->jmpbuffer, 1);
}